

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O1

bool Assimp::FBX::anon_unknown_3::ReadScope
               (TokenList *output_tokens,char *input,char **cursor,char *end,bool is64bits)

{
  char *pcVar1;
  byte *end_00;
  bool is64bits_00;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  long *plVar6;
  byte *pbVar7;
  long lVar8;
  Token *pTVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  Token **__args;
  undefined8 uVar13;
  int iVar14;
  undefined7 in_register_00000081;
  byte *pbVar15;
  ulong uVar16;
  ulong uVar17;
  char *sb;
  char *se;
  undefined1 local_e0 [32];
  byte *local_c0;
  uint64_t local_b8;
  byte *local_b0;
  byte *local_a8;
  char **local_a0;
  vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *local_98;
  int local_8c;
  uint64_t local_88;
  ulong local_80;
  byte *local_78;
  uint32_t local_6c;
  byte *local_68;
  undefined8 local_60;
  byte local_58 [16];
  char *local_48;
  undefined8 local_40;
  ulong local_38;
  
  iVar14 = (int)CONCAT71(in_register_00000081,is64bits);
  if (iVar14 == 0) {
    uVar3 = ReadWord(input,cursor,end);
    uVar5 = (uint64_t)uVar3;
  }
  else {
    uVar5 = ReadDoubleWord(input,cursor,end);
  }
  local_80 = uVar5;
  if (uVar5 != 0) {
    if ((ulong)((long)end - (long)input) < uVar5) {
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"block offset is out of range","");
      TokenizeError((string *)local_e0,(long)*cursor - (long)input);
    }
    if (uVar5 < (ulong)((long)*cursor - (long)input)) {
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"block offset is negative out of range","");
      TokenizeError((string *)local_e0,(long)*cursor - (long)input);
    }
    local_8c = iVar14;
    if (is64bits) {
      local_b8 = ReadDoubleWord(input,cursor,end);
      local_88 = ReadDoubleWord(input,cursor,end);
    }
    else {
      uVar3 = ReadWord(input,cursor,end);
      local_b8 = (uint64_t)uVar3;
      uVar3 = ReadWord(input,cursor,end);
      local_88 = (uint64_t)uVar3;
    }
    ReadString((char **)&local_a8,(char **)&local_b0,input,cursor,end,false,false);
    local_e0._0_8_ = operator_new(0x28);
    pcVar10 = *cursor;
    ((Token *)local_e0._0_8_)->sbegin = (char *)local_a8;
    ((Token *)local_e0._0_8_)->send = (char *)local_b0;
    ((Token *)local_e0._0_8_)->type = TokenType_KEY;
    (((Token *)local_e0._0_8_)->field_3).line = (long)pcVar10 - (long)input;
    ((Token *)local_e0._0_8_)->column = 0xffffffff;
    __args = (Token **)local_e0;
    local_98 = (vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
               output_tokens;
    std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
    emplace_back<Assimp::FBX::Token_const*>
              ((vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>> *)
               output_tokens,__args);
    pcVar10 = *cursor;
    if (local_b8 != 0) {
      local_c0 = (byte *)(pcVar10 + local_88);
      local_48 = pcVar10;
      if ((byte *)*cursor != local_c0) {
        local_38 = local_b8 - 1;
        uVar11 = 1;
        uVar17 = 0;
        pbVar15 = (byte *)*cursor;
        pbVar7 = local_b0;
        local_a0 = cursor;
        do {
          end_00 = local_c0;
          local_58[0] = *pbVar15;
          uVar13 = CONCAT71((int7)((ulong)__args >> 8),local_58[0]);
          *cursor = (char *)(pbVar15 + 1);
          local_a8 = pbVar15;
          local_b0 = pbVar7;
          switch((uint)local_58[0]) {
          case 0x43:
            pbVar7 = pbVar15 + 2;
            goto LAB_006183e3;
          case 0x44:
          case 0x4c:
            pbVar7 = pbVar15 + 9;
            goto LAB_006183e3;
          case 0x45:
          case 0x47:
          case 0x48:
          case 0x4a:
          case 0x4b:
          case 0x4d:
          case 0x4e:
          case 0x4f:
          case 0x50:
          case 0x51:
switchD_0061829d_caseD_45:
            local_68 = local_58;
            local_60 = 1;
            local_58[1] = 0;
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x7101c7);
            local_e0._0_8_ = *plVar6;
            pTVar9 = (Token *)(plVar6 + 2);
            if ((Token *)local_e0._0_8_ == pTVar9) {
              local_e0._16_8_ = pTVar9->sbegin;
              local_e0._24_8_ = plVar6[3];
              local_e0._0_8_ = (Token *)(local_e0 + 0x10);
            }
            else {
              local_e0._16_8_ = pTVar9->sbegin;
            }
            local_e0._8_8_ = plVar6[1];
            *plVar6 = (long)pTVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            TokenizeError((string *)local_e0,(long)*cursor - (long)input);
          case 0x46:
          case 0x49:
            pbVar7 = pbVar15 + 5;
LAB_006183e3:
            *cursor = (char *)pbVar7;
            break;
          case 0x52:
            uVar3 = ReadWord(input,cursor,(char *)local_c0);
            *cursor = *cursor + uVar3;
            break;
          case 0x53:
            ReadString((char **)local_e0,(char **)&local_68,input,cursor,(char *)local_c0,true,true)
            ;
            break;
          default:
            uVar2 = local_58[0] - 0x59;
            if (0x13 < uVar2) goto switchD_0061829d_caseD_45;
            if ((0x92c00U >> (uVar2 & 0x1f) & 1) == 0) {
              if (uVar2 == 0) {
                pbVar7 = pbVar15 + 3;
              }
              else {
                pbVar7 = local_c0;
                if (uVar2 != 9) goto switchD_0061829d_caseD_45;
              }
              goto LAB_006183e3;
            }
            local_78 = pbVar7;
            local_40 = uVar13;
            local_6c = ReadWord(input,local_a0,(char *)local_c0);
            uVar3 = ReadWord(input,local_a0,(char *)end_00);
            cursor = local_a0;
            uVar4 = ReadWord(input,local_a0,(char *)end_00);
            if (uVar3 != 1) {
              if (uVar3 != 0) {
                local_b0 = local_78;
                local_e0._0_8_ = local_e0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_e0,"cannot ReadData, unknown encoding","");
                TokenizeError((string *)local_e0,(long)*local_a0 - (long)input);
              }
              uVar2 = (int)local_40 - 99;
              iVar14 = 0;
              if ((byte)uVar2 < 10) {
                iVar14 = *(int *)(&DAT_0070fee0 + (ulong)(uVar2 & 0xff) * 4);
              }
              if (iVar14 * local_6c != uVar4) {
                local_b0 = local_78;
                local_e0._0_8_ = local_e0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_e0,
                           "cannot ReadData, calculated data stride differs from what the file claims"
                           ,"");
                TokenizeError((string *)local_e0,(long)*local_a0 - (long)input);
              }
            }
            *cursor = *cursor + uVar4;
            uVar13 = local_40;
            local_b0 = local_78;
          }
          pbVar7 = (byte *)*cursor;
          if (local_c0 < pbVar7) {
            local_68 = local_58;
            local_58[0] = (byte)uVar13;
            local_60 = 1;
            local_58[1] = 0;
            plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x7101ef);
            local_e0._0_8_ = *plVar6;
            pTVar9 = (Token *)(plVar6 + 2);
            if ((Token *)local_e0._0_8_ == pTVar9) {
              local_e0._16_8_ = pTVar9->sbegin;
              local_e0._24_8_ = plVar6[3];
              local_e0._0_8_ = (Token *)(local_e0 + 0x10);
            }
            else {
              local_e0._16_8_ = pTVar9->sbegin;
            }
            local_e0._8_8_ = plVar6[1];
            *plVar6 = (long)pTVar9;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            TokenizeError((string *)local_e0,(long)*cursor - (long)input);
          }
          local_e0._0_8_ = operator_new(0x28);
          ((Token *)local_e0._0_8_)->sbegin = (char *)pbVar15;
          ((Token *)local_e0._0_8_)->send = (char *)pbVar7;
          ((Token *)local_e0._0_8_)->type = TokenType_DATA;
          (((Token *)local_e0._0_8_)->field_3).line = (long)pbVar7 - (long)input;
          ((Token *)local_e0._0_8_)->column = 0xffffffff;
          __args = (Token **)local_e0;
          std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
          emplace_back<Assimp::FBX::Token_const*>(local_98,__args);
          if (local_38 != uVar17) {
            local_e0._0_8_ = operator_new(0x28);
            pcVar10 = *cursor;
            ((Token *)local_e0._0_8_)->sbegin = pcVar10;
            ((Token *)local_e0._0_8_)->send = pcVar10 + 1;
            ((Token *)local_e0._0_8_)->type = TokenType_COMMA;
            (((Token *)local_e0._0_8_)->field_3).line = (long)pcVar10 - (long)input;
            ((Token *)local_e0._0_8_)->column = 0xffffffff;
            __args = (Token **)local_e0;
            std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
            emplace_back<Assimp::FBX::Token_const*>(local_98,__args);
          }
          uVar17 = (ulong)uVar11;
          pcVar10 = local_48;
          local_b0 = pbVar7;
          if (local_b8 <= uVar17) goto LAB_006184f9;
          uVar11 = uVar11 + 1;
          pbVar15 = (byte *)*cursor;
        } while ((byte *)*cursor != local_c0);
      }
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"cannot ReadData, out of bounds reading length","");
      TokenizeError((string *)local_e0,(long)*cursor - (long)input);
    }
LAB_006184f9:
    uVar17 = local_80;
    pcVar1 = *cursor;
    if ((long)pcVar1 - (long)pcVar10 != local_88) {
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"property length not reached, something is wrong","");
      TokenizeError((string *)local_e0,(long)*cursor - (long)input);
    }
    pbVar7 = (byte *)0xfffffffffffffff3;
    if ((char)local_8c != '\0') {
      pbVar7 = (byte *)0xffffffffffffffe7;
    }
    uVar12 = 0xd;
    if ((char)local_8c != '\0') {
      uVar12 = 0x19;
    }
    uVar16 = (long)pcVar1 - (long)input;
    if (uVar16 < local_80) {
      local_c0 = pbVar7;
      if (local_80 - uVar16 < uVar12) {
        local_e0._0_8_ = local_e0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_e0,"insufficient padding bytes at block end","");
        TokenizeError((string *)local_e0,(long)*cursor - (long)input);
      }
      local_e0._0_8_ = operator_new(0x28);
      ((Token *)local_e0._0_8_)->sbegin = pcVar1;
      ((Token *)local_e0._0_8_)->send = pcVar1 + 1;
      ((Token *)local_e0._0_8_)->type = TokenType_OPEN_BRACKET;
      (((Token *)local_e0._0_8_)->field_3).line = uVar16;
      ((Token *)local_e0._0_8_)->column = 0xffffffff;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)local_e0);
      pcVar10 = *cursor;
      uVar16 = (long)pcVar10 - (long)input;
      local_b8 = uVar12;
      if (uVar16 < uVar17 - uVar12) {
        pbVar7 = local_c0 + (long)(input + local_80);
        is64bits_00 = (bool)(char)local_8c;
        do {
          ReadScope((TokenList *)local_98,input,cursor,(char *)pbVar7,is64bits_00);
          pcVar10 = *cursor;
          uVar16 = (long)pcVar10 - (long)input;
        } while (uVar16 < uVar17 - uVar12);
      }
      local_e0._0_8_ = operator_new(0x28);
      ((Token *)local_e0._0_8_)->sbegin = pcVar10;
      ((Token *)local_e0._0_8_)->send = pcVar10 + 1;
      ((Token *)local_e0._0_8_)->type = TokenType_CLOSE_BRACKET;
      (((Token *)local_e0._0_8_)->field_3).line = uVar16;
      ((Token *)local_e0._0_8_)->column = 0xffffffff;
      std::vector<Assimp::FBX::Token_const*,std::allocator<Assimp::FBX::Token_const*>>::
      emplace_back<Assimp::FBX::Token_const*>(local_98,(Token **)local_e0);
      lVar8 = 0;
      do {
        if ((*cursor)[lVar8] != '\0') {
          local_e0._0_8_ = local_e0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e0,
                     "failed to read nested block sentinel, expected all bytes to be 0","");
          TokenizeError((string *)local_e0,(long)*cursor - (long)input);
        }
        lVar8 = lVar8 + 1;
      } while ((uint)lVar8 < (uint)local_b8);
      *cursor = *cursor + local_b8;
    }
    if ((long)*cursor - (long)input != local_80) {
      local_e0._0_8_ = local_e0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"scope length not reached, something is wrong","");
      TokenizeError((string *)local_e0,(long)*cursor - (long)input);
    }
  }
  return local_80 != 0;
}

Assistant:

bool ReadScope(TokenList& output_tokens, const char* input, const char*& cursor, const char* end, bool const is64bits)
{
    // the first word contains the offset at which this block ends
	const uint64_t end_offset = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // we may get 0 if reading reached the end of the file -
    // fbx files have a mysterious extra footer which I don't know
    // how to extract any information from, but at least it always
    // starts with a 0.
    if(!end_offset) {
        return false;
    }

    if(end_offset > Offset(input, end)) {
        TokenizeError("block offset is out of range",input, cursor);
    }
    else if(end_offset < Offset(input, cursor)) {
        TokenizeError("block offset is negative out of range",input, cursor);
    }

    // the second data word contains the number of properties in the scope
	const uint64_t prop_count = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // the third data word contains the length of the property list
	const uint64_t prop_length = is64bits ? ReadDoubleWord(input, cursor, end) : ReadWord(input, cursor, end);

    // now comes the name of the scope/key
    const char* sbeg, *send;
    ReadString(sbeg, send, input, cursor, end);

    output_tokens.push_back(new_Token(sbeg, send, TokenType_KEY, Offset(input, cursor) ));

    // now come the individual properties
    const char* begin_cursor = cursor;
    for (unsigned int i = 0; i < prop_count; ++i) {
        ReadData(sbeg, send, input, cursor, begin_cursor + prop_length);

        output_tokens.push_back(new_Token(sbeg, send, TokenType_DATA, Offset(input, cursor) ));

        if(i != prop_count-1) {
            output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_COMMA, Offset(input, cursor) ));
        }
    }

    if (Offset(begin_cursor, cursor) != prop_length) {
        TokenizeError("property length not reached, something is wrong",input, cursor);
    }

    // at the end of each nested block, there is a NUL record to indicate
    // that the sub-scope exists (i.e. to distinguish between P: and P : {})
    // this NUL record is 13 bytes long on 32 bit version and 25 bytes long on 64 bit.
	const size_t sentinel_block_length = is64bits ? (sizeof(uint64_t)* 3 + 1) : (sizeof(uint32_t)* 3 + 1);

    if (Offset(input, cursor) < end_offset) {
        if (end_offset - Offset(input, cursor) < sentinel_block_length) {
            TokenizeError("insufficient padding bytes at block end",input, cursor);
        }

        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_OPEN_BRACKET, Offset(input, cursor) ));

        // XXX this is vulnerable to stack overflowing ..
        while(Offset(input, cursor) < end_offset - sentinel_block_length) {
			ReadScope(output_tokens, input, cursor, input + end_offset - sentinel_block_length, is64bits);
        }
        output_tokens.push_back(new_Token(cursor, cursor + 1, TokenType_CLOSE_BRACKET, Offset(input, cursor) ));

        for (unsigned int i = 0; i < sentinel_block_length; ++i) {
            if(cursor[i] != '\0') {
                TokenizeError("failed to read nested block sentinel, expected all bytes to be 0",input, cursor);
            }
        }
        cursor += sentinel_block_length;
    }

    if (Offset(input, cursor) != end_offset) {
        TokenizeError("scope length not reached, something is wrong",input, cursor);
    }

    return true;
}